

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall Matrix::GenerateMatrix(Matrix *this,int n,int param)

{
  int iVar1;
  ulong uVar2;
  undefined8 extraout_RDX;
  int j;
  ulong uVar3;
  double *pdVar4;
  int i;
  ulong uVar5;
  double dVar6;
  result_type_conflict rVar7;
  Matrix MVar8;
  uniform_real_distribution<double> distr;
  random_device device;
  uniform_real_distribution<double> local_13c8;
  random_device local_13b8;
  
  Matrix(this,n,n);
  std::random_device::random_device(&local_13b8);
  dVar6 = exp2((double)param * 0.25);
  local_13c8._M_param._M_b = exp2((double)param * 0.25);
  pdVar4 = this->data;
  uVar5 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  iVar1 = this->cols;
  local_13c8._M_param._M_a = -dVar6;
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      rVar7 = std::uniform_real_distribution<double>::operator()(&local_13c8,&local_13b8);
      pdVar4[uVar3] = rVar7;
    }
    pdVar4 = pdVar4 + iVar1;
  }
  std::random_device::~random_device(&local_13b8);
  MVar8.rows = (int)extraout_RDX;
  MVar8.cols = (int)((ulong)extraout_RDX >> 0x20);
  MVar8.data = (double *)this;
  return MVar8;
}

Assistant:

Matrix Matrix::GenerateMatrix(int n, int param)
{
    Matrix m(n, n);

    std::random_device device;
    std::uniform_real_distribution<double> distr(
        -pow(2, static_cast<double>(param) / 4),
        pow(2, static_cast<double>(param) / 4)
    );

    for (int i = 0; i < n; ++i)
    {
        for (int j = 0; j < n; j++)
        {
            const auto generated = distr(device);
            m(i, j) = generated;
        }
    }

    return m;
}